

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

Instr * __thiscall
GlobOpt::PRE::InsertPropertySymPreloadInLandingPad
          (PRE *this,Instr *ldInstr,Loop *loop,PropertySym *propertySym)

{
  Opnd *pOVar1;
  PropertySym *pPVar2;
  BasicBlock *pBVar3;
  SymOpnd *this_00;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  code *pcVar4;
  OpndKind OVar5;
  bool bVar6;
  undefined4 *puVar7;
  Value *pVVar8;
  Value *pVVar9;
  PropertySymOpnd *pPVar10;
  StackSym *pSVar11;
  
  pOVar1 = ldInstr->m_src1;
  OVar5 = IR::Opnd::GetKind(pOVar1);
  if (OVar5 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar6) goto LAB_00447dd8;
    *puVar7 = 0;
  }
  pPVar2 = (PropertySym *)pOVar1[1]._vptr_Opnd;
  if (pPVar2 != propertySym) {
    pBVar3 = this->globOpt->currentBlock;
    if ((pPVar2->super_Sym).m_kind != SymKindProperty) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
      if (!bVar6) goto LAB_00447dd8;
      *puVar7 = 0;
    }
    pVVar8 = GlobOptBlockData::FindValue(&pBVar3->globOptData,&pPVar2->m_stackSym->super_Sym);
    pVVar9 = GlobOptBlockData::FindValue
                       (&this->globOpt->currentBlock->globOptData,
                        &propertySym->m_stackSym->super_Sym);
    if (pVVar8 == (Value *)0x0) {
      return (Instr *)0x0;
    }
    if (pVVar9 == (Value *)0x0) {
      return (Instr *)0x0;
    }
    if (pVVar8->valueNumber != pVVar9->valueNumber) {
      return (Instr *)0x0;
    }
  }
  pOVar1 = ldInstr->m_src1;
  OVar5 = IR::Opnd::GetKind(pOVar1);
  if (OVar5 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar6) goto LAB_00447dd8;
    *puVar7 = 0;
  }
  pOVar1[1]._vptr_Opnd = (_func_int **)propertySym;
  this_00 = (SymOpnd *)ldInstr->m_src1;
  OVar5 = IR::Opnd::GetKind((Opnd *)this_00);
  if (OVar5 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar6) {
LAB_00447dd8:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  bVar6 = IR::SymOpnd::IsPropertySymOpnd(this_00);
  if (bVar6) {
    pPVar10 = IR::Opnd::AsPropertySymOpnd((Opnd *)this_00);
    pPVar10 = IR::Opnd::AsPropertySymOpnd((Opnd *)pPVar10);
    pPVar10 = IR::PropertySymOpnd::CopyWithoutFlowSensitiveInfo(pPVar10,this->globOpt->func);
    IR::Instr::ReplaceSrc1(ldInstr,(Opnd *)pPVar10);
  }
  if (ldInstr->m_dst != (Opnd *)0x0) {
    this_01 = (loop->landingPad->globOptData).liveVarSyms;
    pSVar11 = IR::Opnd::GetStackSym(ldInstr->m_dst);
    BVSparse<Memory::JitArenaAllocator>::Set(this_01,(pSVar11->super_Sym).m_id);
  }
  InsertInstrInLandingPad(this,ldInstr,loop);
  return ldInstr;
}

Assistant:

IR::Instr *
GlobOpt::PRE::InsertPropertySymPreloadInLandingPad(IR::Instr * ldInstr, Loop * loop, PropertySym * propertySym)
{
    IR::SymOpnd *ldSrc = ldInstr->GetSrc1()->AsSymOpnd();

    if (ldSrc->m_sym != propertySym)
    {
        // It's possible that the property syms are different but have equivalent objPtrs. Verify their values.
        Value *val1 = globOpt->CurrentBlockData()->FindValue(ldSrc->m_sym->AsPropertySym()->m_stackSym);
        Value *val2 = globOpt->CurrentBlockData()->FindValue(propertySym->m_stackSym);
        if (!val1 || !val2 || val1->GetValueNumber() != val2->GetValueNumber())
        {
            return nullptr;
        }
    }

    // Consider: Shouldn't be necessary once we have copy-prop in prepass...
    ldInstr->GetSrc1()->AsSymOpnd()->m_sym = propertySym;
    ldSrc = ldInstr->GetSrc1()->AsSymOpnd();

    if (ldSrc->IsPropertySymOpnd())
    {
        IR::PropertySymOpnd *propSymOpnd = ldSrc->AsPropertySymOpnd();
        IR::PropertySymOpnd *newPropSymOpnd;

        newPropSymOpnd = propSymOpnd->AsPropertySymOpnd()->CopyWithoutFlowSensitiveInfo(this->globOpt->func);
        ldInstr->ReplaceSrc1(newPropSymOpnd);
    }

    if (ldInstr->GetDst())
    {
        loop->landingPad->globOptData.liveVarSyms->Set(ldInstr->GetDst()->GetStackSym()->m_id);
    }

    InsertInstrInLandingPad(ldInstr, loop);

    return ldInstr;
}